

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O1

int_type __thiscall fmt::v6::internal::formatbuf<char>::overflow(formatbuf<char> *this,int_type ch)

{
  buffer<char> *pbVar1;
  size_t sVar2;
  
  if (ch != -1) {
    pbVar1 = this->buffer_;
    if (pbVar1->capacity_ < pbVar1->size_ + 1) {
      (**pbVar1->_vptr_buffer)(pbVar1);
    }
    sVar2 = pbVar1->size_;
    pbVar1->size_ = sVar2 + 1;
    pbVar1->ptr_[sVar2] = (char)ch;
  }
  return ch;
}

Assistant:

int_type overflow(int_type ch = traits_type::eof()) FMT_OVERRIDE {
    if (!traits_type::eq_int_type(ch, traits_type::eof()))
      buffer_.push_back(static_cast<Char>(ch));
    return ch;
  }